

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O3

int RecvDataMDMx(MDM *pMDM,uchar *buf,int buflen,int *pReceivedBytes)

{
  int iVar1;
  ssize_t sVar2;
  char *pcVar3;
  char *pcVar4;
  
  if (pMDM->InternalBufferSize < buflen) {
    pcVar4 = "Too many data to receive at once. ";
  }
  else {
    iVar1 = (pMDM->RS232Port).DevType;
    pcVar4 = "Error receiving data with a MDM. ";
    if (iVar1 - 1U < 4) {
      sVar2 = recv((pMDM->RS232Port).s,buf,(long)buflen,0);
      iVar1 = (int)sVar2;
      *pReceivedBytes = iVar1;
    }
    else {
      if (iVar1 != 0) goto LAB_0010a9ea;
      sVar2 = read(*(int *)&(pMDM->RS232Port).hDev,buf,(ulong)(uint)buflen);
      iVar1 = (int)sVar2;
      *pReceivedBytes = iVar1;
    }
    if (0 < iVar1) {
      return 0;
    }
  }
LAB_0010a9ea:
  pcVar3 = strtime_m();
  printf("RecvDataMDM error (%s) : %s(pMDM=%#x)\n",pcVar3,pcVar4,(ulong)pMDM & 0xffffffff);
  return 1;
}

Assistant:

HARDWAREX_API int RecvDataMDMx(MDM* pMDM, unsigned char* buf, int buflen, int* pReceivedBytes)
{
	return RecvDataMDM(pMDM, buf, buflen, pReceivedBytes);
}